

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

float * ma_dr_mp3__full_read_and_close_f32
                  (ma_dr_mp3 *pMP3,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount)

{
  _func_void_void_ptr_void_ptr *p_Var1;
  ulong framesToRead;
  ma_uint32 mVar2;
  ma_uint64 mVar3;
  float *pfVar4;
  float *p;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float temp [4096];
  float local_4038 [4098];
  
  p = (float *)0x0;
  uVar5 = 0;
  uVar8 = 0;
  while( true ) {
    framesToRead = 0x1000 / (ulong)pMP3->channels;
    mVar3 = ma_dr_mp3_read_pcm_frames_f32(pMP3,framesToRead,local_4038);
    uVar7 = uVar8;
    if (mVar3 == 0) break;
    uVar7 = mVar3 + uVar8;
    uVar6 = uVar5;
    pfVar4 = p;
    if (uVar5 < uVar7) {
      uVar6 = uVar5 * 2;
      if (uVar5 * 2 <= uVar7) {
        uVar6 = uVar7;
      }
      pfVar4 = (float *)ma_dr_mp3__realloc_from_callbacks
                                  (p,uVar6 * pMP3->channels * 4,uVar5 * pMP3->channels * 4,
                                   &pMP3->allocationCallbacks);
      if (pfVar4 == (float *)0x0) {
        if (p == (float *)0x0) {
          p = (float *)0x0;
          uVar7 = uVar8;
        }
        else {
          p_Var1 = (pMP3->allocationCallbacks).onFree;
          uVar7 = uVar8;
          if (p_Var1 != (_func_void_void_ptr_void_ptr *)0x0) {
            (*p_Var1)(p,(pMP3->allocationCallbacks).pUserData);
          }
        }
        break;
      }
    }
    p = pfVar4;
    memcpy(p + uVar8 * pMP3->channels,local_4038,pMP3->channels * mVar3 * 4);
    uVar5 = uVar6;
    uVar8 = uVar7;
    if (mVar3 != framesToRead) break;
  }
  if (pConfig != (ma_dr_mp3_config *)0x0) {
    mVar2 = pMP3->sampleRate;
    pConfig->channels = pMP3->channels;
    pConfig->sampleRate = mVar2;
  }
  ma_dr_mp3_uninit(pMP3);
  if (pTotalFrameCount != (ma_uint64 *)0x0) {
    *pTotalFrameCount = uVar7;
  }
  return p;
}

Assistant:

static float* ma_dr_mp3__full_read_and_close_f32(ma_dr_mp3* pMP3, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint64 framesCapacity = 0;
    float* pFrames = NULL;
    float temp[4096];
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    for (;;) {
        ma_uint64 framesToReadRightNow = MA_DR_MP3_COUNTOF(temp) / pMP3->channels;
        ma_uint64 framesJustRead = ma_dr_mp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }
        if (framesCapacity < totalFramesRead + framesJustRead) {
            ma_uint64 oldFramesBufferSize;
            ma_uint64 newFramesBufferSize;
            ma_uint64 newFramesCap;
            float* pNewFrames;
            newFramesCap = framesCapacity * 2;
            if (newFramesCap < totalFramesRead + framesJustRead) {
                newFramesCap = totalFramesRead + framesJustRead;
            }
            oldFramesBufferSize = framesCapacity * pMP3->channels * sizeof(float);
            newFramesBufferSize = newFramesCap   * pMP3->channels * sizeof(float);
            if (newFramesBufferSize > (ma_uint64)MA_SIZE_MAX) {
                break;
            }
            pNewFrames = (float*)ma_dr_mp3__realloc_from_callbacks(pFrames, (size_t)newFramesBufferSize, (size_t)oldFramesBufferSize, &pMP3->allocationCallbacks);
            if (pNewFrames == NULL) {
                ma_dr_mp3__free_from_callbacks(pFrames, &pMP3->allocationCallbacks);
                break;
            }
            pFrames = pNewFrames;
            framesCapacity = newFramesCap;
        }
        MA_DR_MP3_COPY_MEMORY(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(float)));
        totalFramesRead += framesJustRead;
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }
    if (pConfig != NULL) {
        pConfig->channels   = pMP3->channels;
        pConfig->sampleRate = pMP3->sampleRate;
    }
    ma_dr_mp3_uninit(pMP3);
    if (pTotalFrameCount) {
        *pTotalFrameCount = totalFramesRead;
    }
    return pFrames;
}